

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dialog_widgets.cpp
# Opt level: O0

void Am_Show_Alert_Dialog(Am_Value_List *alert_texts,int x,int y,bool modal)

{
  bool bVar1;
  Am_Wrapper *pAVar2;
  Am_Method_Wrapper *pAVar3;
  Am_Object *this;
  Am_Object local_80;
  Am_Object local_78;
  undefined1 local_70 [8];
  Am_Value dummy;
  Am_Object local_58;
  Am_Value_List local_50;
  Am_Object local_40 [3];
  Am_Object local_28;
  Am_Object the_dialog;
  bool modal_local;
  int y_local;
  int x_local;
  Am_Value_List *alert_texts_local;
  
  the_dialog.data._7_1_ = modal;
  Am_Object::Am_Object(&local_28);
  bVar1 = Am_Value_List::Empty(&cached_alert_dialogs);
  if (bVar1) {
    Am_Object::Create(local_40,(char *)&Am_Alert_Dialog);
    Am_Object::operator=(&local_28,local_40);
    Am_Object::~Am_Object(local_40);
  }
  else {
    Am_Value_List::Pop(&local_50,true);
    Am_Object::operator=(&local_28,(Am_Value *)&local_50);
    Am_Value::~Am_Value((Am_Value *)&local_50);
  }
  pAVar2 = Am_Value_List::operator_cast_to_Am_Wrapper_(alert_texts);
  Am_Object::Set(&local_28,0xa2,pAVar2,0);
  Am_Object::Get_Object(&local_58,(Am_Slot_Key)&local_28,0xc5);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_stop_waiting_for_dialog);
  this = Am_Object::Set(&local_58,0xca,pAVar3,0);
  pAVar3 = Am_Object_Method::operator_cast_to_Am_Method_Wrapper_(&do_abort_waiting_for_dialog);
  Am_Object::Set(this,0xc9,pAVar3,0);
  Am_Object::~Am_Object(&local_58);
  Am_Object::Am_Object((Am_Object *)&dummy.value,&local_28);
  Am_Object::Add_Part(&Am_Screen,(Am_Object *)&dummy.value,true,0);
  Am_Object::~Am_Object((Am_Object *)&dummy.value);
  set_dialog_position(&local_28,x,y);
  Am_Value::Am_Value((Am_Value *)local_70);
  Am_Object::Am_Object(&local_78,&local_28);
  Am_Pop_Up_Window_And_Wait(&local_78,(Am_Value *)local_70,(bool)(the_dialog.data._7_1_ & 1));
  Am_Object::~Am_Object(&local_78);
  Am_Object::Am_Object(&local_80,&local_28);
  Am_Object::Remove_Part(&Am_Screen,&local_80);
  Am_Object::~Am_Object(&local_80);
  pAVar2 = Am_Object::operator_cast_to_Am_Wrapper_(&local_28);
  Am_Value_List::Push(&cached_alert_dialogs,pAVar2,true);
  Am_Value::~Am_Value((Am_Value *)local_70);
  Am_Object::~Am_Object(&local_28);
  return;
}

Assistant:

void
Am_Show_Alert_Dialog(Am_Value_List alert_texts,
                     int x /* = Am_AT_CENTER_SCREEN*/,
                     int y /*= Am_AT_CENTER_SCREEN*/, bool modal /*= false*/)
{
  Am_Object the_dialog;
  if (cached_alert_dialogs.Empty())
    the_dialog = Am_Alert_Dialog.Create();
  else {
    the_dialog = cached_alert_dialogs.Pop();
  }
  the_dialog.Set(Am_ITEMS, alert_texts);
  the_dialog.Get_Object(Am_COMMAND)
      .Set(Am_DO_METHOD, do_stop_waiting_for_dialog)
      .Set(Am_ABORT_DO_METHOD, do_abort_waiting_for_dialog);
  Am_Screen.Add_Part(the_dialog);
  set_dialog_position(the_dialog, x, y);
  Am_Value dummy;
  Am_Pop_Up_Window_And_Wait(the_dialog, dummy, modal);
  Am_Screen.Remove_Part(the_dialog);
  cached_alert_dialogs.Push(the_dialog);
}